

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_9::DiskFile::copy(DiskFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  unsigned_long *result;
  Maybe<unsigned_long> local_58;
  undefined1 local_48 [8];
  NullableValue<unsigned_long> _result1554;
  uint64_t size_local;
  uint64_t fromOffset_local;
  ReadableFile *from_local;
  uint64_t offset_local;
  DiskFile *this_local;
  
  DiskHandle::copy((DiskHandle *)&local_58,(EVP_PKEY_CTX *)&this->super_DiskHandle,dst);
  other = kj::_::readMaybe<unsigned_long>(&local_58);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_48,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_58);
  puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_48);
  if (puVar1 == (unsigned_long *)0x0) {
    this_local._0_4_ = File::copy(&this->super_File,dst,src);
  }
  else {
    puVar1 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_48);
    this_local._0_4_ = (int)*puVar1;
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_48);
  return (int)this_local;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t size) const override {
    KJ_IF_SOME(result, DiskHandle::copy(offset, from, fromOffset, size)) {
      return result;
    } else {
      return File::copy(offset, from, fromOffset, size);
    }